

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inlining.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_225::Planner::visitCall(Planner *this,Call *curr)

{
  InliningState *pIVar1;
  bool bVar2;
  size_type sVar3;
  Name *this_00;
  Function *pFVar4;
  Module *pMVar5;
  size_type sVar6;
  vector<wasm::(anonymous_namespace)::InliningAction,std::allocator<wasm::(anonymous_namespace)::InliningAction>>
  *this_01;
  Function *local_68;
  Expression **local_60;
  Builder local_58;
  Block *local_50;
  Block *block;
  Iterator local_40;
  Iterator local_30;
  bool local_19;
  Call *pCStack_18;
  bool isUnreachable;
  Call *curr_local;
  Planner *this_local;
  
  pCStack_18 = curr;
  curr_local = (Call *)this;
  if ((curr->isReturn & 1U) == 0) {
    block._0_4_ = 1;
    local_19 = wasm::Type::operator==
                         (&(curr->super_SpecificExpression<(wasm::Expression::Id)6>).
                           super_Expression.type,(BasicType *)&block);
  }
  else {
    local_30 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                         (&(curr->operands).
                           super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         );
    local_40 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                         (&(pCStack_18->operands).
                           super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         );
    local_19 = std::
               any_of<ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::Iterator,wasm::(anonymous_namespace)::Planner::visitCall(wasm::Call*)::_lambda(wasm::Expression*)_1_>
                         (local_30.parent,local_30.index,local_40.parent,local_40.index);
  }
  sVar3 = std::
          unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
          ::count(&this->state->worthInlining,&pCStack_18->target);
  if ((sVar3 != 0) && ((local_19 & 1U) == 0)) {
    this_00 = &pCStack_18->target;
    pFVar4 = Walker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>
             ::getFunction(&(this->
                            super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>_>
                            ).
                            super_PostWalker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>
                            .
                            super_Walker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>
                          );
    bVar2 = IString::operator!=(&this_00->super_IString,(IString *)pFVar4);
    if (bVar2) {
      pMVar5 = Walker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>
               ::getModule(&(this->
                            super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>_>
                            ).
                            super_PostWalker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>
                            .
                            super_Walker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>
                          );
      Builder::Builder(&local_58,pMVar5);
      local_50 = Builder::makeBlock(&local_58,(Expression *)pCStack_18);
      Walker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>
      ::replaceCurrent(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>_>
                        ).
                        super_PostWalker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>
                        .
                        super_Walker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>
                       ,(Expression *)local_50);
      pIVar1 = this->state;
      pFVar4 = Walker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>
               ::getFunction(&(this->
                              super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>_>
                              ).
                              super_PostWalker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>
                              .
                              super_Walker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>
                            );
      sVar6 = std::
              unordered_map<wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>_>
              ::count(&pIVar1->actionsForFunction,(key_type *)pFVar4);
      if (sVar6 == 0) {
        __assert_fail("state->actionsForFunction.count(getFunction()->name) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Inlining.cpp"
                      ,0xef,"void wasm::(anonymous namespace)::Planner::visitCall(Call *)");
      }
      pIVar1 = this->state;
      pFVar4 = Walker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>
               ::getFunction(&(this->
                              super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>_>
                              ).
                              super_PostWalker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>
                              .
                              super_Walker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>
                            );
      this_01 = (vector<wasm::(anonymous_namespace)::InliningAction,std::allocator<wasm::(anonymous_namespace)::InliningAction>>
                 *)std::
                   unordered_map<wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>_>
                   ::operator[](&pIVar1->actionsForFunction,(key_type *)pFVar4);
      local_60 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(local_50->list).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,0);
      pMVar5 = Walker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>
               ::getModule(&(this->
                            super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>_>
                            ).
                            super_PostWalker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>
                            .
                            super_Walker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>
                          );
      local_68 = Module::getFunction(pMVar5,(Name)(pCStack_18->target).super_IString.str);
      std::
      vector<wasm::(anonymous_namespace)::InliningAction,std::allocator<wasm::(anonymous_namespace)::InliningAction>>
      ::emplace_back<wasm::Expression**,wasm::Function*>(this_01,&local_60,&local_68);
    }
  }
  return;
}

Assistant:

void visitCall(Call* curr) {
    // plan to inline if we know this is valid to inline, and if the call is
    // actually performed - if it is dead code, it's pointless to inline.
    // we also cannot inline ourselves.
    bool isUnreachable;
    if (curr->isReturn) {
      // Tail calls are only actually unreachable if an argument is
      isUnreachable = std::any_of(
        curr->operands.begin(), curr->operands.end(), [](Expression* op) {
          return op->type == Type::unreachable;
        });
    } else {
      isUnreachable = curr->type == Type::unreachable;
    }
    if (state->worthInlining.count(curr->target) && !isUnreachable &&
        curr->target != getFunction()->name) {
      // nest the call in a block. that way the location of the pointer to the
      // call will not change even if we inline multiple times into the same
      // function, otherwise call1(call2()) might be a problem
      auto* block = Builder(*getModule()).makeBlock(curr);
      replaceCurrent(block);
      // can't add a new element in parallel
      assert(state->actionsForFunction.count(getFunction()->name) > 0);
      state->actionsForFunction[getFunction()->name].emplace_back(
        &block->list[0], getModule()->getFunction(curr->target));
    }
  }